

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerFactory.cpp
# Opt level: O3

shared_ptr<helics::Broker>
helics::BrokerFactory::create(CoreType type,string_view brokerName,int argc,char **argv)

{
  element_type *peVar1;
  bool bVar2;
  HelicsException *this;
  char *pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  CoreType type_00;
  undefined4 in_register_0000003c;
  shared_ptr<helics::Broker> *broker;
  shared_ptr<helics::Broker> sVar5;
  string_view name;
  string_view message;
  string newName;
  int in_stack_ffffffffffffff84;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  CoreType local_58;
  _Alloc_hider local_50;
  char local_40 [8];
  undefined8 in_stack_ffffffffffffffc8;
  
  broker = (shared_ptr<helics::Broker> *)CONCAT44(in_register_0000003c,type);
  pcVar3 = brokerName._M_str;
  type_00 = (CoreType)brokerName._M_len;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  if ((type_00 == EXTRACT) || (pcVar3 == (char *)0x0)) {
    helics::core::extractCoreType_abi_cxx11_
              (in_stack_ffffffffffffff84,(char **)in_stack_ffffffffffffffc8);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_78,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50);
    if (local_50._M_p != local_40) {
      operator_delete(local_50._M_p,(long)local_40 + 1);
    }
    if (pcVar3 == (char *)0x0) {
      pcVar3 = (char *)local_78._M_string_length;
    }
    if (type_00 == EXTRACT) {
      type_00 = local_58;
    }
  }
  name._M_len = (ulong)type_00;
  name._M_str = pcVar3;
  makeBroker(type,name);
  peVar1 = (broker->super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (*peVar1->_vptr_Broker[9])(peVar1,(ulong)argv & 0xffffffff);
  bVar2 = registerBroker(broker,type_00);
  if (!bVar2) {
    this = (HelicsException *)__cxa_allocate_exception(0x28);
    message._M_str = "unable to register broker";
    message._M_len = 0x19;
    HelicsException::HelicsException(this,message);
    *(undefined ***)this = &PTR__HelicsException_0054b138;
    __cxa_throw(this,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
  }
  (*((broker->super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_Broker
    [2])();
  _Var4._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
    _Var4._M_pi = extraout_RDX_00;
  }
  sVar5.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  sVar5.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)broker;
  return (shared_ptr<helics::Broker>)
         sVar5.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Broker> create(CoreType type, std::string_view brokerName, int argc, char* argv[])
{
    std::string newName;
    CoreType newType;
    if (type == CoreType::EXTRACT || brokerName.empty()) {
        std::tie(newType, newName) = core::extractCoreType(argc, argv);
        if (brokerName.empty() && !newName.empty()) {
            brokerName = newName;
        }
        if (type == CoreType::EXTRACT) {
            type = newType;
        }
    }
    auto broker = makeBroker(type, brokerName);
    broker->configureFromArgs(argc, argv);
    if (!registerBroker(broker, type)) {
        throw(helics::RegistrationFailure("unable to register broker"));
    }
    broker->connect();
    return broker;
}